

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O1

void gen_mfvsrd(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGTemp *a1;
  uintptr_t o;
  uint32_t excp;
  uintptr_t o_1;
  
  s = ctx->uc->tcg_ctx;
  if ((ctx->opcode & 1) == 0) {
    if (ctx->fpu_enabled != false) {
LAB_00bc66a2:
      a1 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
      tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)a1,(TCGArg)(s->cpu_env + (long)s),
                        (ulong)((ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5) * 0x10 +
                               0x12b28));
      if (cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f] != (TCGv_i64)((long)a1 - (long)s)) {
        tcg_gen_op2_ppc64(s,INDEX_op_mov_i64,
                          (TCGArg)((long)&s->pool_cur +
                                  (long)cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f]),
                          (TCGArg)a1);
      }
      tcg_temp_free_internal_ppc64(s,(TCGTemp *)((TCGv_i64)((long)a1 - (long)s) + (long)s));
      return;
    }
    excp = 7;
  }
  else {
    if (ctx->altivec_enabled != false) goto LAB_00bc66a2;
    excp = 0x49;
  }
  gen_exception(ctx,excp);
  return;
}

Assistant:

static void gen_mfvsrd(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t0;
    if (xS(ctx->opcode) < 32) {
        if (unlikely(!ctx->fpu_enabled)) {
            gen_exception(ctx, POWERPC_EXCP_FPU);
            return;
        }
    } else {
        if (unlikely(!ctx->altivec_enabled)) {
            gen_exception(ctx, POWERPC_EXCP_VPU);
            return;
        }
    }
    t0 = tcg_temp_new_i64(tcg_ctx);
    get_cpu_vsrh(tcg_ctx, t0, xS(ctx->opcode));
    tcg_gen_mov_i64(tcg_ctx, cpu_gpr[rA(ctx->opcode)], t0);
    tcg_temp_free_i64(tcg_ctx, t0);
}